

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationY.hpp
# Opt level: O2

void __thiscall
qclab::qgates::CRotationY<std::complex<float>_>::CRotationY
          (CRotationY<std::complex<float>_> *this,int control,int target,rotation_type *rot,
          int controlState)

{
  uint __line;
  char *__assertion;
  int target_local;
  
  target_local = target;
  QControlledGate2<std::complex<float>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<float>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004d1090;
  std::
  make_unique<qclab::qgates::RotationY<std::complex<float>>,int_const&,qclab::QRotation<float>const&>
            ((int *)&this->gate_,(QRotation<float> *)&target_local);
  if (control < 0) {
    __assertion = "control >= 0";
  }
  else {
    if (-1 < target_local) {
      if (target_local != control) {
        return;
      }
      __assertion = "control != target";
      __line = 0x32;
      goto LAB_00345bb2;
    }
    __assertion = "target >= 0";
  }
  __line = 0x31;
LAB_00345bb2:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationY.hpp"
                ,__line,
                "qclab::qgates::CRotationY<std::complex<float>>::CRotationY(const int, const int, const rotation_type &, const int) [T = std::complex<float>]"
               );
}

Assistant:

CRotationY( const int control , const int target ,
                    const rotation_type& rot , const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< RotationY< T > >( target , rot ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }